

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cartridge.c
# Opt level: O0

void gb_parse_header(GameboyRom *rom,CartridgeHeader *header)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  CartridgeHeader *header_local;
  GameboyRom *rom_local;
  
  puVar1 = rom->data;
  uVar2 = *(undefined8 *)(puVar1 + 0x104);
  uVar3 = *(undefined8 *)(puVar1 + 0x10c);
  uVar4 = *(undefined8 *)(puVar1 + 0x114);
  uVar5 = *(undefined8 *)(puVar1 + 0x11c);
  uVar6 = *(undefined8 *)(puVar1 + 300);
  *(undefined8 *)(header->logo + 0x20) = *(undefined8 *)(puVar1 + 0x124);
  *(undefined8 *)(header->logo + 0x28) = uVar6;
  *(undefined8 *)(header->logo + 0x10) = uVar4;
  *(undefined8 *)(header->logo + 0x18) = uVar5;
  *(undefined8 *)header->logo = uVar2;
  *(undefined8 *)(header->logo + 8) = uVar3;
  uVar2 = *(undefined8 *)(rom->data + 0x13c);
  *(undefined8 *)header->title = *(undefined8 *)(rom->data + 0x134);
  *(undefined8 *)(header->title + 8) = uVar2;
  header->title[0x10] = '\0';
  header->color_gameboy_only = rom->data[0x143] == 0xc0;
  header->super_gameboy_support = rom->data[0x146] == '\x03';
  switch(rom->data[0x147]) {
  case '\0':
  case '\b':
  case '\t':
    header->type = MB_ROM_ONLY;
    break;
  case '\x01':
  case '\x02':
  case '\x03':
    header->type = MB_MBC_1;
    break;
  default:
    header->type = MB_UNKNOWN;
    break;
  case '\x05':
  case '\x06':
    header->type = MB_MBC_2;
    break;
  case '\v':
  case '\f':
  case '\r':
    header->type = MB_MM01;
    break;
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    header->type = MB_MBC_3;
    break;
  case '\x19':
  case '\x1a':
  case '\x1b':
  case '\x1c':
  case '\x1d':
  case '\x1e':
    header->type = MB_MBC_5;
    break;
  case ' ':
    header->type = MB_MBC_6;
    break;
  case '\"':
    header->type = MB_MBC_7;
    break;
  case 0xfc:
    header->type = MB_POCKET_CAMERA;
    break;
  case 0xfd:
    header->type = MB_BANDAI_TAMA5;
  }
  header->rom_size = 0x20 << (rom->data[0x148] & 0x1f);
  iVar7 = header->rom_size;
  if (iVar7 < 0) {
    iVar7 = iVar7 + 0xf;
  }
  header->rom_banks = iVar7 >> 4;
  switch(rom->data[0x149]) {
  case '\0':
  case '\x01':
  default:
    header->ram_size = 0;
    break;
  case '\x02':
    header->ram_size = 8;
    break;
  case '\x03':
    header->ram_size = 0x20;
    break;
  case '\x04':
    header->ram_size = 0x80;
    break;
  case '\x05':
    header->ram_size = 0x40;
  }
  header->ram_banks = header->ram_size / 8;
  header->destination = (uint)(rom->data[0x14a] != '\0');
  header->version = rom->data[0x14c];
  header->header_checksum = rom->data[0x14d];
  header->global_checksum = CONCAT11(rom->data[0x14d],rom->data[0x14e]);
  return;
}

Assistant:

void gb_parse_header(GameboyRom* rom, CartridgeHeader* header) {

    //Logo
    memcpy(&header->logo[0], &rom->data[LOGO_START], sizeof(uint8_t) * LOGO_SIZE);
    
    //Title
    memcpy(&header->title[0], &rom->data[TITLE_START], sizeof(uint8_t) * TITLE_SIZE);
    header->title[TITLE_SIZE] = '\0';

    //TODO: 0x80 is multi-platform 0xC0 is color gameboy only. What if
    //it contains something else?
    header->color_gameboy_only = rom->data[COLOR_GAMEBOY_FLAG] == 0xC0;

    header->super_gameboy_support = rom->data[SUPER_GAMEBOY_SUPPORT] == 0x03;

    //Cartridge Type
    switch(rom->data[MEMORY_BANK_ADDRESS]) {
        case 0x00: case 0x08: case 0x09:
            header->type = MB_ROM_ONLY;
            break;
        case 0x01: case 0x02: case 0x03:
            header->type = MB_MBC_1;
            break;
        case 0x05: case 0x06:
            header->type = MB_MBC_2;
            break;
        case 0x0B: case 0x0C: case 0x0D:
            header->type = MB_MM01;
            break;
        case 0x0F: case 0x10: case 0x11: case 0x12: case 0x13:
            header->type = MB_MBC_3;
            break;
        case 0x19: case 0x1A: case 0x1B: case 0x1C: case 0x1D: case 0x1E:
            header->type = MB_MBC_5;
            break;
        case 0x20:
            header->type = MB_MBC_6;
            break;
        case 0x22:
            header->type = MB_MBC_7;
            break;
        case 0xFC:
            header->type = MB_POCKET_CAMERA;
            break;
        case 0xFD:
            header->type = MB_BANDAI_TAMA5;
            break;
        default:
            header->type = MB_UNKNOWN;
            break;
    }
    
    //TODO: There are some sizes that are non-standard
    header->rom_size = 32 << rom->data[ROM_SIZE_ADDRESS];
    header->rom_banks = header->rom_size / 16;

    //TODO: What if we get something bigger than 0x05
    switch(rom->data[RAM_SIZE_ADDRESS]) {
        case 0x05:
            header->ram_size = 64;
            break;
        case 0x04:
            header->ram_size = 128;
            break;
        case 0x03:
            header->ram_size = 32;
            break;
        case 0x02:
            header->ram_size = 8;
            break;
        case 0x00: case 0x01:
        default:
            header->ram_size = 0;
            break;
    }
    header->ram_banks = header->ram_size / 8;
    
    header->destination = rom->data[DESTINATION_CODE_ADDRESS] == 0x00 ? DST_JAPAN : DST_WORLD;

    header->version = rom->data[VERSION_ADDRESS];

    header->header_checksum = rom->data[HEADER_CHECKSUM_ADDRESS];
    header->global_checksum = (uint16_t) (rom->data[HEADER_CHECKSUM_ADDRESS] << 8 | rom->data[HEADER_CHECKSUM_ADDRESS + 1]);
}